

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

void optimal_init(_encode_match_data *emd)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = calloc(1,0x40);
  emd->priv = pvVar1;
  *(code **)((long)pvVar1 + 0x18) = optimal_encode_int;
  *(code **)((long)pvVar1 + 0x20) = optimal_encode_int;
  pvVar2 = calloc(1,0x40);
  *(void **)((long)pvVar1 + 0x28) = pvVar2;
  return;
}

Assistant:

void optimal_init(encode_match_data emd)        /* IN/OUT */
{
    encode_match_privp data;
    interval_nodep *inpp;

    emd->priv = malloc(sizeof(encode_match_priv));
    data = emd->priv;

    memset(data, 0, sizeof(encode_match_priv));

    data->offset_f = optimal_encode_int;
    data->len_f = optimal_encode_int;
    inpp = malloc(sizeof(interval_nodep[8]));
    inpp[0] = NULL;
    inpp[1] = NULL;
    inpp[2] = NULL;
    inpp[3] = NULL;
    inpp[4] = NULL;
    inpp[5] = NULL;
    inpp[6] = NULL;
    inpp[7] = NULL;
    data->offset_f_priv = inpp;
    data->len_f_priv = NULL;
}